

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::GenerateMessageDocComment
               (Printer *printer,Descriptor *message)

{
  bool bVar1;
  undefined1 auStack_78 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  _Alloc_hider local_48;
  size_type local_40;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  pointer local_28;
  pointer pbStack_20;
  pointer local_18;
  
  io::Printer::Print(printer,"/**\n");
  auStack_78._16_8_ = &local_58;
  auStack_78._24_8_ = 0;
  local_58._M_local_buf[0] = '\0';
  local_48._M_p = (pointer)&local_38;
  local_40 = 0;
  local_38._M_local_buf[0] = '\0';
  local_28 = (pointer)0x0;
  pbStack_20 = (pointer)0x0;
  local_18 = (pointer)0x0;
  bVar1 = Descriptor::GetSourceLocation(message,(SourceLocation *)auStack_78);
  if (bVar1) {
    GenerateDocCommentBodyForLocation(printer,(SourceLocation *)auStack_78);
  }
  SourceLocation::~SourceLocation((SourceLocation *)auStack_78);
  EscapePhpdoc((string *)auStack_78,*(string **)(message + 8));
  io::Printer::Print(printer," * Protobuf type <code>^fullname^</code>\n */\n","fullname",
                     (string *)auStack_78);
  std::__cxx11::string::~string((string *)auStack_78);
  return;
}

Assistant:

void GenerateMessageDocComment(io::Printer* printer,
                               const Descriptor* message) {
  printer->Print("/**\n");
  GenerateDocCommentBody(printer, message);
  printer->Print(
    " * Protobuf type <code>^fullname^</code>\n"
    " */\n",
    "fullname", EscapePhpdoc(message->full_name()));
}